

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

int duckdb_brotli::CopyFromCompoundDictionary(BrotliDecoderStateInternal *s,int pos)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  long in_RDI;
  int length;
  int rem_chunk_length;
  int space;
  uint8_t *copy_src;
  uint8_t *copy_dst;
  int orig_pos;
  BrotliDecoderCompoundDictionary *addon;
  int local_3c;
  int local_c;
  
  lVar1 = *(long *)(in_RDI + 0x328);
  local_c = in_ESI;
  do {
    if (*(int *)(lVar1 + 0x10) == *(int *)(lVar1 + 0x14)) break;
    iVar2 = *(int *)(in_RDI + 100) - local_c;
    iVar3 = (*(int *)(lVar1 + 0x98 + (long)(*(int *)(lVar1 + 8) + 1) * 4) -
            *(int *)(lVar1 + 0x98 + (long)*(int *)(lVar1 + 8) * 4)) - *(int *)(lVar1 + 0xc);
    local_3c = *(int *)(lVar1 + 0x10) - *(int *)(lVar1 + 0x14);
    if (iVar3 < local_3c) {
      local_3c = iVar3;
    }
    if (iVar2 < local_3c) {
      local_3c = iVar2;
    }
    memcpy((void *)(*(long *)(in_RDI + 0x88) + (long)local_c),
           (void *)(*(long *)(lVar1 + 0x18 + (long)*(int *)(lVar1 + 8) * 8) +
                   (long)*(int *)(lVar1 + 0xc)),(long)local_3c);
    local_c = local_3c + local_c;
    *(int *)(lVar1 + 0xc) = local_3c + *(int *)(lVar1 + 0xc);
    *(int *)(lVar1 + 0x14) = local_3c + *(int *)(lVar1 + 0x14);
    if (local_3c == iVar3) {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      *(undefined4 *)(lVar1 + 0xc) = 0;
    }
  } while (local_c != *(int *)(in_RDI + 100));
  return local_c - in_ESI;
}

Assistant:

static int CopyFromCompoundDictionary(BrotliDecoderState *s, int pos) {
	BrotliDecoderCompoundDictionary *addon = s->compound_dictionary;
	int orig_pos = pos;
	while (addon->br_length != addon->br_copied) {
		uint8_t *copy_dst = &s->ringbuffer[pos];
		const uint8_t *copy_src = addon->chunks[addon->br_index] + addon->br_offset;
		int space = s->ringbuffer_size - pos;
		int rem_chunk_length =
		    (addon->chunk_offsets[addon->br_index + 1] - addon->chunk_offsets[addon->br_index]) - addon->br_offset;
		int length = addon->br_length - addon->br_copied;
		if (length > rem_chunk_length)
			length = rem_chunk_length;
		if (length > space)
			length = space;
		memcpy(copy_dst, copy_src, (size_t)length);
		pos += length;
		addon->br_offset += length;
		addon->br_copied += length;
		if (length == rem_chunk_length) {
			addon->br_index++;
			addon->br_offset = 0;
		}
		if (pos == s->ringbuffer_size)
			break;
	}
	return pos - orig_pos;
}